

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_22::ValidateBranch(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  DiagnosticStream *this;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *target;
  Instruction *pIStack_20;
  uint id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  target._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,target._4_4_);
  if ((local_30 != (Instruction *)0x0) && (OVar1 = Instruction::opcode(local_30), OVar1 == OpLabel))
  {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag
            (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
  this = DiagnosticStream::operator<<
                   (&local_208,
                    (char (*) [78])
                    "\'Target Label\' operands for OpBranch must be the ID of an OpLabel instruction"
                   );
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
  DiagnosticStream::~DiagnosticStream(&local_208);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateBranch(ValidationState_t& _, const Instruction* inst) {
  // target operands must be OpLabel
  const auto id = inst->GetOperandAs<uint32_t>(0);
  const auto target = _.FindDef(id);
  if (!target || spv::Op::OpLabel != target->opcode()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "'Target Label' operands for OpBranch must be the ID "
              "of an OpLabel instruction";
  }

  return SPV_SUCCESS;
}